

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfasttext.cc
# Opt level: O0

void cft_fasttext_predictions_free(fasttext_predictions_t *predictions)

{
  long *in_RDI;
  fasttext_prediction_t pred;
  size_t i;
  ulong local_10;
  
  if (in_RDI != (long *)0x0) {
    for (local_10 = 0; local_10 < (ulong)in_RDI[1]; local_10 = local_10 + 1) {
      free(*(void **)(*in_RDI + local_10 * 0x10 + 8));
    }
    free((void *)*in_RDI);
    free(in_RDI);
  }
  return;
}

Assistant:

void cft_fasttext_predictions_free(fasttext_predictions_t* predictions) {
    if (predictions == nullptr) {
        return;
    }
    for (size_t i = 0; i < predictions->length; i++) {
        fasttext_prediction_t pred = predictions->predictions[i];
        free(pred.label);
    }
    free(predictions->predictions);
    free(predictions);
}